

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGhsMultiGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this)

{
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override { return GetActualName(); }